

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O0

ostream * tactile::operator<<(ostream *os,Range *r)

{
  ostream *poVar1;
  float fVar2;
  Range *r_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"[");
  fVar2 = Range::min(r);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,",");
  fVar2 = Range::max(r);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,"]");
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Range &r)
{
	return os << "[" << r.min() << "," << r.max() << "]";
}